

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  MessageLevel message;
  undefined8 uVar4;
  char *pcVar5;
  cmInstallDirectoryGenerator *this_01;
  cmGlobalGenerator *this_02;
  ostream *poVar6;
  bool bVar7;
  int iVar8;
  pointer pbVar9;
  uint uVar10;
  ulong uVar11;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string literal_args;
  pointer local_258;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [6];
  ios_base local_1e0 [264];
  undefined8 local_d8;
  undefined8 local_d0;
  string component;
  string permissions_dir;
  string permissions_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string local_50;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  component._M_dataplus._M_p = (pointer)&component.field_2;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&component,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  literal_args.field_2._M_local_buf[0] = '\0';
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) < 0x21) {
    if (dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar7 = true;
      goto LAB_002ff5af;
    }
  }
  else {
    iVar8 = 1;
    uVar11 = 1;
    uVar10 = 2;
    local_258 = (pointer)0x0;
    local_d8 = 0;
    local_d0 = 0;
    bVar7 = false;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar9 + uVar11));
      if (iVar3 == 0) {
        iVar8 = 2;
        if (!bVar7) goto LAB_002fef7a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      uVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if ((int)uVar4 == 0) {
        if (!bVar7) {
          local_d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          goto LAB_002fef78;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      uVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if ((int)uVar4 == 0) {
        if (!bVar7) {
          local_d8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          goto LAB_002fef78;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 3;
LAB_002fef4e:
        bVar7 = true;
        goto LAB_002fef7a;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 4;
        goto LAB_002fef4e;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        if ((iVar8 - 5U < 0xfffffffe) && (bVar7)) goto LAB_002fef6e;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" before a PATTERN or REGEX is given.",0x25);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        if (bVar7) {
          iVar8 = 7;
          std::__cxx11::string::append((char *)&literal_args);
          goto LAB_002fef7a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" before a PATTERN or REGEX is given.",0x25);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 5;
        if (!bVar7) goto LAB_002fef7a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 6;
        if (!bVar7) goto LAB_002fef7a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        if (!bVar7) {
LAB_002fef6e:
          std::__cxx11::string::append((char *)&literal_args);
          goto LAB_002fef78;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        if (!bVar7) goto LAB_002fef6e;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 8;
        if (!bVar7) goto LAB_002fef7a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar3 == 0) {
        iVar8 = 9;
        if (!bVar7) goto LAB_002fef7a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," does not allow \"",0x11);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
      switch(iVar8) {
      case 1:
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        pcVar1 = pbVar9[uVar11]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dir,pcVar1,pcVar1 + pbVar9[uVar11]._M_string_length);
        bVar2 = cmsys::SystemTools::FileIsFullPath(dir._M_dataplus._M_p);
        if (!bVar2) {
          pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::operator=((string *)&dir,pcVar5);
          std::__cxx11::string::append((char *)&dir);
          std::__cxx11::string::_M_append
                    ((char *)&dir,
                     (ulong)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
        }
        bVar2 = cmsys::SystemTools::FileExists(dir._M_dataplus._M_p);
        if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory(&dir), !bVar2)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," given non-directory \"",0x16);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" to install.",0xd);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          std::ios_base::~ios_base(local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir._M_dataplus._M_p != &dir.field_2) {
            operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ff5ad;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&dirs,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        iVar8 = 1;
        break;
      case 2:
        local_258 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
        goto LAB_002fef78;
      case 3:
        std::__cxx11::string::append((char *)&literal_args);
        cmsys::Glob::PatternToRegex
                  ((string *)&e,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar11,false,false);
        cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)_e);
        std::__cxx11::string::append((char *)&literal_args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_240) {
LAB_002ff153:
          operator_delete(_e,local_240[0]._M_allocated_capacity + 1);
        }
        goto LAB_002fef78;
      case 4:
        std::__cxx11::string::append((char *)&literal_args);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = pbVar9[uVar11]._M_dataplus._M_p;
        _e = (pointer)local_240;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&e,pcVar1,pcVar1 + pbVar9[uVar11]._M_string_length);
        cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)_e);
        std::__cxx11::string::append((char *)&literal_args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_240) goto LAB_002ff153;
        goto LAB_002fef78;
      case 5:
        bVar2 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar11,&permissions_file);
        iVar8 = 5;
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," given invalid file permission \"",0x20);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir._M_dataplus._M_p != &dir.field_2) {
            operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ff58f;
        }
        break;
      case 6:
        bVar2 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar11,&permissions_dir);
        iVar8 = 6;
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," given invalid directory permission \"",0x25);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir._M_dataplus._M_p != &dir.field_2) {
            operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ff58f;
        }
        break;
      case 7:
        bVar2 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar11,&literal_args);
        iVar8 = 7;
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," given invalid permission \"",0x1b);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir._M_dataplus._M_p != &dir.field_2) {
            operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ff58f;
        }
        break;
      case 8:
        iVar8 = 8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&configurations,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar11);
        break;
      case 9:
        std::__cxx11::string::_M_assign((string *)&component);
LAB_002fef78:
        iVar8 = 0;
        break;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," given unknown argument \"",0x19)
        ;
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,pbVar9[uVar11]._M_dataplus._M_p,pbVar9[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ff58f;
      }
LAB_002fef7a:
      uVar11 = (ulong)uVar10;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
    if ((dirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         dirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (local_258 != (char *)0x0)) {
      _e = (pointer)local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_e != local_240) {
        operator_delete(_e,local_240[0]._M_allocated_capacity + 1);
      }
    }
    bVar7 = true;
    if (dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ff5af;
    if (local_258 != (char *)0x0) {
      message = cmInstallGenerator::SelectMessageLevel
                          ((this->super_cmCommand).Makefile,(bool)((byte)local_d8 & 1));
      this_00 = (this->super_cmCommand).Makefile;
      this_01 = (cmInstallDirectoryGenerator *)operator_new(0x140);
      cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
                (this_01,&dirs,local_258,permissions_file._M_dataplus._M_p,
                 permissions_dir._M_dataplus._M_p,&configurations,component._M_dataplus._M_p,message
                 ,literal_args._M_dataplus._M_p,(bool)((byte)local_d0 & 1));
      cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
      this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      cmGlobalGenerator::AddInstallComponent(this_02,component._M_dataplus._M_p);
      goto LAB_002ff5af;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&e,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," given no DESTINATION!",0x16);
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(&this->super_cmCommand,&dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dir._M_dataplus._M_p != &dir.field_2) {
    operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
  }
LAB_002ff58f:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  std::ios_base::~ios_base(local_1e0);
LAB_002ff5ad:
  bVar7 = false;
LAB_002ff5af:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)literal_args._M_dataplus._M_p != &literal_args.field_2) {
    operator_delete(literal_args._M_dataplus._M_p,
                    CONCAT71(literal_args.field_2._M_allocated_capacity._1_7_,
                             literal_args.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)component._M_dataplus._M_p != &component.field_2) {
    operator_delete(component._M_dataplus._M_p,component.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_dir._M_dataplus._M_p != &permissions_dir.field_2) {
    operator_delete(permissions_dir._M_dataplus._M_p,
                    CONCAT71(permissions_dir.field_2._M_allocated_capacity._1_7_,
                             permissions_dir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_file._M_dataplus._M_p != &permissions_file.field_2) {
    operator_delete(permissions_file._M_dataplus._M_p,
                    CONCAT71(permissions_file.field_2._M_allocated_capacity._1_7_,
                             permissions_file.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  return bVar7;
}

Assistant:

bool
cmInstallCommand::HandleDirectoryMode(std::vector<std::string> const& args)
{
  enum Doing { DoingNone, DoingDirs, DoingDestination, DoingPattern,
               DoingRegex, DoingPermsFile, DoingPermsDir, DoingPermsMatch,
               DoingConfigurations, DoingComponent };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = 0;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "DESTINATION")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the destination property.
      doing = DoingDestination;
      }
    else if(args[i] == "OPTIONAL")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
      }
    else if(args[i] == "MESSAGE_NEVER")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
      }
    else if(args[i] == "PATTERN")
      {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
      }
    else if(args[i] == "REGEX")
      {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
      }
    else if(args[i] == "EXCLUDE")
      {
      // Add this property to the current match rule.
      if(!in_match_mode || doing == DoingPattern || doing == DoingRegex)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }
      literal_args += " EXCLUDE";
      doing = DoingNone;
      }
    else if(args[i] == "PERMISSIONS")
      {
      if(!in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
      }
    else if(args[i] == "FILE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
      }
    else if(args[i] == "DIRECTORY_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
      }
    else if(args[i] == "USE_SOURCE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
      }
    else if(args[i] == "FILES_MATCHING")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
      }
    else if(args[i] == "CONFIGURATIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
      }
    else if(args[i] == "COMPONENT")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the component property.
      doing = DoingComponent;
      }
    else if(doing == DoingDirs)
      {
      // Convert this directory to a full path.
      std::string dir = args[i];
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
        }

      // Make sure the name is a directory.
      if(cmSystemTools::FileExists(dir.c_str()) &&
         !cmSystemTools::FileIsDirectory(dir))
        {
        std::ostringstream e;
        e << args[0] << " given non-directory \""
          << args[i] << "\" to install.";
        this->SetError(e.str());
        return false;
        }

      // Store the directory for installation.
      dirs.push_back(dir);
      }
    else if(doing == DoingConfigurations)
      {
      configurations.push_back(args[i]);
      }
    else if(doing == DoingDestination)
      {
      destination = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingPattern)
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
      }
    else if(doing == DoingRegex)
      {
      literal_args += " REGEX \"";
    // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
      }
    else if(doing == DoingComponent)
      {
      component = args[i];
      doing = DoingNone;
      }
    else if(doing == DoingPermsFile)
     {
     // Check the requested permission.
     if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_file))
        {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsDir)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_dir))
        {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsMatch)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i], literal_args))
        {
        std::ostringstream e;
        e << args[0] << " given invalid permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else
      {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Support installing an empty directory.
  if(dirs.empty() && destination)
    {
    dirs.push_back("");
    }

  // Check if there is something to do.
  if(dirs.empty())
    {
    return true;
    }
  if(!destination)
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(
    new cmInstallDirectoryGenerator(dirs, destination,
                                    permissions_file.c_str(),
                                    permissions_dir.c_str(),
                                    configurations,
                                    component.c_str(),
                                    message,
                                    literal_args.c_str(),
                                    optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()
    ->AddInstallComponent(component.c_str());

  return true;
}